

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polyline.h
# Opt level: O1

Unique<Polyline<2L>_> __thiscall
anurbs::Polyline<2L>::load(Polyline<2L> *this,Model *model,Json *data)

{
  undefined8 *puVar1;
  pointer pMVar2;
  const_reference pvVar3;
  ulong uVar4;
  pointer *__ptr;
  size_type sVar5;
  Index i;
  long lVar6;
  value_type points;
  Matrix<double,_1,_2,_1,_1,_2> ret;
  undefined1 local_58 [8];
  json_value local_50;
  key_type local_48;
  
  pMVar2 = (pointer)operator_new(0x18);
  *(undefined8 *)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage =
       0;
  *(double *)
   ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage + 8) =
       0.0;
  *(undefined8 *)&pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage =
       0;
  (this->m_points).
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pMVar2;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"points","");
  pvVar3 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(data,&local_48);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_58,pvVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  sVar5 = (size_type)local_58[0];
  if (local_58[0] != null) {
    if (local_58[0] == object) {
      sVar5 = ((local_50.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    else if (local_58[0] == array) {
      sVar5 = (long)(((local_50.object)->m_keys)._M_h._M_bucket_count -
                    (long)((local_50.object)->m_keys)._M_h._M_buckets) >> 4;
    }
    else {
      sVar5 = 1;
    }
  }
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::resize((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            *)(this->m_points).
              super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start,sVar5);
  lVar6 = 0;
  sVar5 = 0;
  while( true ) {
    uVar4 = (ulong)local_58[0];
    if (local_58[0] != null) {
      if (local_58[0] == object) {
        uVar4 = ((local_50.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      else if (local_58[0] == array) {
        uVar4 = (long)(((local_50.object)->m_keys)._M_h._M_bucket_count -
                      (long)((local_50.object)->m_keys)._M_h._M_buckets) >> 4;
      }
      else {
        uVar4 = 1;
      }
    }
    if ((long)uVar4 <= (long)sVar5) break;
    pvVar3 = nlohmann::
             basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[]((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)local_58,sVar5);
    nlohmann::adl_serializer<Eigen::Matrix<double,1,2,1,1,2>,void>::
    from_json<nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (pvVar3,(Vector<2> *)&local_48);
    puVar1 = (undefined8 *)
             (*(long *)&(((this->m_points).
                          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage +
             lVar6);
    *puVar1 = local_48._M_dataplus._M_p;
    puVar1[1] = local_48._M_string_length;
    sVar5 = sVar5 + 1;
    lVar6 = lVar6 + 0x10;
  }
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_58);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_58 + 8),local_58[0]);
  return (__uniq_ptr_data<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Polyline<TDimension>> load(Model& model, const Json& data)
    {
        auto result = new_<Polyline<TDimension>>();

        // load Points
        {
            const auto points = data.at("points");

            result->m_points.resize(points.size());

            for (Index i = 0; i < length(points); i++) {
                result->m_points[i] = points[i];
            }
        }

        return result;
    }